

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfArray.h
# Opt level: O1

void __thiscall
Imf_3_2::Array<Imf_3_2::Array2D<Imf_3_2::FrameBuffer>_>::~Array
          (Array<Imf_3_2::Array2D<Imf_3_2::FrameBuffer>_> *this)

{
  Array2D<Imf_3_2::FrameBuffer> *pAVar1;
  FrameBuffer *pFVar2;
  FrameBuffer *pFVar3;
  size_t sVar4;
  long lVar5;
  Array2D<Imf_3_2::FrameBuffer> *pAVar6;
  
  pAVar1 = this->_data;
  if (pAVar1 != (Array2D<Imf_3_2::FrameBuffer> *)0x0) {
    pFVar2 = pAVar1[-1]._data;
    if (pFVar2 != (FrameBuffer *)0x0) {
      pAVar6 = pAVar1 + (long)pFVar2;
      do {
        pFVar3 = pAVar6[-1]._data;
        if (pFVar3 != (FrameBuffer *)0x0) {
          sVar4 = pFVar3[-1]._map._M_t._M_impl.super__Rb_tree_header._M_node_count;
          if (sVar4 != 0) {
            lVar5 = sVar4 * 0x30;
            do {
              std::
              _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
              ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                           *)(&pFVar3[-1]._map._M_t._M_impl.field_0x0 + lVar5));
              lVar5 = lVar5 + -0x30;
            } while (lVar5 != 0);
          }
          operator_delete__(&pFVar3[-1]._map._M_t._M_impl.super__Rb_tree_header._M_node_count,
                            sVar4 * 0x30 + 8);
        }
        pAVar6 = pAVar6 + -1;
      } while (pAVar6 != pAVar1);
    }
    operator_delete__(&pAVar1[-1]._data,(long)pFVar2 * 0x18 + 8);
    return;
  }
  return;
}

Assistant:

~Array () { delete[] _data; }